

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinylogger.h
# Opt level: O0

shared_ptr<tlog::ConsoleOutput> * tlog::ConsoleOutput::global(void)

{
  int iVar1;
  ConsoleOutput *this;
  
  if (global()::consoleOutput == '\0') {
    iVar1 = __cxa_guard_acquire(&global()::consoleOutput);
    if (iVar1 != 0) {
      this = (ConsoleOutput *)operator_new(0x10);
      ConsoleOutput(this);
      std::shared_ptr<tlog::ConsoleOutput>::shared_ptr<tlog::ConsoleOutput,void>
                (&global::consoleOutput,this);
      __cxa_atexit(std::shared_ptr<tlog::ConsoleOutput>::~shared_ptr,&global::consoleOutput,
                   &__dso_handle);
      __cxa_guard_release(&global()::consoleOutput);
    }
  }
  return &global::consoleOutput;
}

Assistant:

static std::shared_ptr<ConsoleOutput>& global() {
            static auto consoleOutput = std::shared_ptr<ConsoleOutput>(new ConsoleOutput());
            return consoleOutput;
        }